

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O2

int SZ_BufftoBuffDecompress
              (void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uchar *__src;
  sbyte sVar5;
  uint uVar6;
  int iVar7;
  uchar *__dest;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *src8;
  ulong uVar11;
  size_t __size;
  size_t __n;
  ulong local_80;
  aec_stream_conflict local_78;
  
  uVar1 = param->pixels_per_block;
  iVar4 = param->pixels_per_scanline;
  uVar3 = (int)(uVar1 + iVar4 + -1) / (int)uVar1;
  local_78.block_size = uVar1;
  local_78.rsi = uVar3;
  local_78.flags = convert_options(param->options_mask);
  iVar7 = iVar4 % (int)uVar1;
  uVar2 = param->bits_per_pixel;
  uVar6 = 8;
  if ((uVar2 != 0x20) && (uVar2 != 0x40)) {
    uVar6 = uVar2;
  }
  local_78.next_in = (uchar *)source;
  local_78.avail_in = sourceLen;
  local_78.bits_per_sample = uVar6;
  if (iVar7 == 0) {
    if ((uVar2 != 0x20) && (uVar2 != 0x40)) {
      __size = *destLen;
      __src = (uchar *)0x0;
      local_78.next_out = (uchar *)dest;
      goto LAB_0011ca8c;
    }
    __size = *destLen;
  }
  else {
    sVar5 = 8 < (int)uVar6;
    if (0x10 < (int)uVar6) {
      sVar5 = 2;
    }
    local_80 = (((*destLen >> sVar5) + (long)iVar4) - 1) / (ulong)(long)iVar4;
    __size = (uVar3 * uVar1 << sVar5) * local_80;
  }
  __src = (uchar *)malloc(__size);
  local_78.next_out = __src;
  if (__src == (uchar *)0x0) {
    return -4;
  }
LAB_0011ca8c:
  local_78.avail_out = __size;
  iVar4 = aec_buffer_decode(&local_78);
  if (iVar4 == 0) {
    if (iVar7 != 0) {
      sVar5 = 8 < (int)uVar6;
      iVar4 = param->pixels_per_scanline;
      if (0x10 < (int)uVar6) {
        sVar5 = 2;
      }
      __n = (size_t)(iVar4 << sVar5);
      uVar10 = (local_78.block_size * local_78.rsi - iVar4 << sVar5) + __n;
      __dest = __src;
      for (uVar11 = uVar10; __dest = __dest + __n, uVar11 < local_78.total_out;
          uVar11 = uVar11 + uVar10) {
        memmove(__dest,__src + uVar11,__n);
      }
      sVar5 = 8 < (int)uVar6;
      if (0x10 < (int)uVar6) {
        sVar5 = 2;
      }
      local_78.total_out = local_80 * (long)iVar4 << sVar5;
    }
    uVar11 = *destLen;
    if (local_78.total_out < *destLen) {
      *destLen = local_78.total_out;
      uVar11 = local_78.total_out;
    }
    if ((uVar2 == 0x40) || (uVar2 == 0x20)) {
      uVar8 = (ulong)(param->bits_per_pixel / 8);
      for (uVar10 = 0; iVar4 = 0, uVar10 < uVar11 / uVar8; uVar10 = uVar10 + 1) {
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          *(uchar *)((long)dest + uVar9) = __src[uVar9 * (uVar11 / uVar8) + uVar10];
        }
        dest = (void *)((long)dest + uVar8);
      }
    }
    else {
      iVar4 = 0;
      if (iVar7 != 0) {
        memcpy(dest,__src,uVar11);
        iVar4 = 0;
      }
    }
  }
  if ((iVar7 != 0 || (uVar2 == 0x20 || uVar2 == 0x40)) && __src != (uchar *)0x0) {
    free(__src);
  }
  return iVar4;
}

Assistant:

int SZ_BufftoBuffDecompress(void *dest, size_t *destLen,
                            const void *source, size_t sourceLen,
                            SZ_com_t *param)
{
    struct aec_stream strm;
    int status;
    size_t total_out;
    size_t scanlines;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = convert_options(param->options_mask);
    strm.avail_in = sourceLen;
    strm.next_in = source;
    void *buf = 0;

    int pad_scanline = param->pixels_per_scanline % param->pixels_per_block;
    int deinterleave = (param->bits_per_pixel == 32
                        || param->bits_per_pixel == 64);
    int extra_buffer = pad_scanline || deinterleave;
    int pixel_size;

    if (deinterleave)
        strm.bits_per_sample = 8;
    else
        strm.bits_per_sample = param->bits_per_pixel;
    pixel_size = bits_to_bytes(strm.bits_per_sample);


    if (extra_buffer) {
        size_t buf_size;
        if (pad_scanline) {
            scanlines = (*destLen / pixel_size + param->pixels_per_scanline - 1)
                / param->pixels_per_scanline;
            buf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
        } else {
            buf_size = *destLen;
        }
        buf = malloc(buf_size);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        strm.next_out = buf;
        strm.avail_out = buf_size;
    } else {
        strm.next_out = dest;
        strm.avail_out = *destLen;
    }

    status = aec_buffer_decode(&strm);
    if (status != AEC_OK)
        goto CLEANUP;

    if (pad_scanline) {
        size_t padding_size =
            (strm.rsi * strm.block_size - param->pixels_per_scanline)
            * pixel_size;
        remove_padding(buf, strm.total_out,
                       param->pixels_per_scanline * pixel_size,
                       padding_size, pixel_size);
        total_out = scanlines * param->pixels_per_scanline * pixel_size;
    } else {
        total_out = strm.total_out;
    }

    if (total_out < *destLen)
        *destLen = total_out;

    if (deinterleave)
        deinterleave_buffer(dest, buf, *destLen, param->bits_per_pixel / 8);
    else if (pad_scanline)
        memcpy(dest, buf, *destLen);

CLEANUP:
    if (extra_buffer && buf)
        free(buf);

    return status;
}